

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionContextAccess(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  bool bVar1;
  uint nameHash;
  ExprFunctionDefinition *pEVar2;
  ExprVariableAccess *pEVar3;
  VariableData *pVVar4;
  ExprVariableAccess *access_1;
  VariableData *variable;
  InplaceStr contextVariableName;
  uint functionIndex;
  ExprVariableAccess *access;
  VariableData *contextVariable;
  ExprFunctionDefinition *definition;
  ExprBase *context;
  ScopeData *curr;
  bool inFunctionScope;
  FunctionData *function_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (function->scope->ownerType == (TypeBase *)0x0) {
    bVar1 = false;
    context = (ExprBase *)ctx->scope;
    while( true ) {
      if ((context == (ExprBase *)0x0) || (context->next != (ExprBase *)0x0)) goto LAB_001ab427;
      if ((FunctionData *)context->type == function) break;
      context = (ExprBase *)context->_vptr_ExprBase;
    }
    bVar1 = true;
LAB_001ab427:
    if (bVar1) {
      definition = (ExprFunctionDefinition *)
                   CreateVariableAccess(ctx,source,function->contextArgument,true);
    }
    else {
      pEVar2 = getType<ExprFunctionDefinition>(function->declaration);
      if (pEVar2 == (ExprFunctionDefinition *)0x0) {
        if ((function->coroutine & 1U) == 0) {
          definition = (ExprFunctionDefinition *)ExpressionContext::get<ExprNullptrLiteral>(ctx);
          ExprNullptrLiteral::ExprNullptrLiteral
                    ((ExprNullptrLiteral *)definition,source,function->contextType);
        }
        else {
          contextVariableName.end._4_4_ = ExpressionContext::GetFunctionIndex(ctx,function);
          if (function->importModule != (ModuleData *)0x0) {
            contextVariableName.end._4_4_ =
                 (contextVariableName.end._4_4_ - function->importModule->startingFunctionIndex) +
                 function->importModule->importedFunctionCount;
          }
          _variable = GetFunctionContextVariableName(ctx,function,contextVariableName.end._4_4_);
          nameHash = InplaceStr::hash((InplaceStr *)&variable);
          pVVar4 = anon_unknown.dwarf_8df1c::LookupVariableByName(ctx,nameHash);
          if (pVVar4 == (VariableData *)0x0) {
            definition = (ExprFunctionDefinition *)ExpressionContext::get<ExprNullptrLiteral>(ctx);
            ExprNullptrLiteral::ExprNullptrLiteral
                      ((ExprNullptrLiteral *)definition,source,function->contextType);
          }
          else {
            definition = (ExprFunctionDefinition *)CreateVariableAccess(ctx,source,pVVar4,true);
            pEVar3 = getType<ExprVariableAccess>((ExprBase *)definition);
            if (pEVar3 != (ExprVariableAccess *)0x0) {
              if (pEVar3->variable != pVVar4) {
                __assert_fail("access->variable == variable",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0xfb7,
                              "ExprBase *CreateFunctionContextAccess(ExpressionContext &, SynBase *, FunctionData *)"
                             );
              }
              definition = (ExprFunctionDefinition *)
                           ExpressionContext::get<ExprFunctionContextAccess>(ctx);
              ExprFunctionContextAccess::ExprFunctionContextAccess
                        ((ExprFunctionContextAccess *)definition,source,
                         (pEVar3->super_ExprBase).type,function,pVVar4);
            }
          }
        }
      }
      else if (pEVar2->contextVariable == (VariableData *)0x0) {
        definition = (ExprFunctionDefinition *)ExpressionContext::get<ExprNullptrLiteral>(ctx);
        ExprNullptrLiteral::ExprNullptrLiteral
                  ((ExprNullptrLiteral *)definition,source,function->contextType);
      }
      else {
        pVVar4 = pEVar2->contextVariable;
        definition = (ExprFunctionDefinition *)CreateVariableAccess(ctx,source,pVVar4,true);
        pEVar3 = getType<ExprVariableAccess>((ExprBase *)definition);
        if (pEVar3 != (ExprVariableAccess *)0x0) {
          if (pEVar3->variable != pVVar4) {
            __assert_fail("access->variable == contextVariable",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0xf9e,
                          "ExprBase *CreateFunctionContextAccess(ExpressionContext &, SynBase *, FunctionData *)"
                         );
          }
          definition = (ExprFunctionDefinition *)
                       ExpressionContext::get<ExprFunctionContextAccess>(ctx);
          ExprFunctionContextAccess::ExprFunctionContextAccess
                    ((ExprFunctionContextAccess *)definition,source,(pEVar3->super_ExprBase).type,
                     function,pVVar4);
        }
      }
    }
    ctx_local = (ExpressionContext *)definition;
  }
  else {
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_8df1c::ReportExpected
                          (ctx,source,function->contextType,
                           "ERROR: member function can\'t be called without a class instance");
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateFunctionContextAccess(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	if(function->scope->ownerType)
		return ReportExpected(ctx, source, function->contextType, "ERROR: member function can't be called without a class instance");

	bool inFunctionScope = false;

	// Walk up, but if we reach a type owner, stop - we're not in a context of a function
	for(ScopeData *curr = ctx.scope; curr; curr = curr->scope)
	{
		if(curr->ownerType)
			break;

		if(curr->ownerFunction == function)
		{
			inFunctionScope = true;
			break;
		}
	}

	ExprBase *context = NULL;

	if(inFunctionScope)
	{
		context = CreateVariableAccess(ctx, source, function->contextArgument, true);
	}
	else if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(function->declaration))
	{
		if(definition->contextVariable)
		{
			VariableData *contextVariable = definition->contextVariable;

			context = CreateVariableAccess(ctx, source, contextVariable, true);

			if(ExprVariableAccess *access = getType<ExprVariableAccess>(context))
			{
				assert(access->variable == contextVariable);

				context = new (ctx.get<ExprFunctionContextAccess>()) ExprFunctionContextAccess(source, access->type, function, contextVariable);
			}
		}
		else
		{
			context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, function->contextType);
		}
	}
	else if(function->coroutine)
	{
		unsigned functionIndex = ctx.GetFunctionIndex(function);

		if(function->importModule)
			functionIndex = functionIndex - function->importModule->startingFunctionIndex + function->importModule->importedFunctionCount;

		InplaceStr contextVariableName = GetFunctionContextVariableName(ctx, function, functionIndex);

		if(VariableData *variable = LookupVariableByName(ctx, contextVariableName.hash()))
		{
			context = CreateVariableAccess(ctx, source, variable, true);

			if(ExprVariableAccess *access = getType<ExprVariableAccess>(context))
			{
				assert(access->variable == variable);

				context = new (ctx.get<ExprFunctionContextAccess>()) ExprFunctionContextAccess(source, access->type, function, variable);
			}
		}
		else
		{
			context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, function->contextType);
		}
	}
	else
	{
		context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, function->contextType);
	}

	return context;
}